

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::JavaPluginTest_PluginTest_Test::
~JavaPluginTest_PluginTest_Test(JavaPluginTest_PluginTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JavaPluginTest, PluginTest) {
  ABSL_CHECK_OK(
      File::SetContents(absl::StrCat(::testing::TempDir(), "/test.proto"),
                        "edition = \"2023\";\n"
                        "package foo;\n"
                        "option java_package = \"\";\n"
                        "option java_outer_classname = \"Test\";\n"
                        "message Bar {\n"
                        "  message Baz {}\n"
                        "}\n"
                        "enum Qux {\n"
                        "  option features.enum_type = CLOSED;\n"
                        "  BLAH = 1;\n"
                        "}\n",
                        true));

  CommandLineInterface cli;
  cli.SetInputsAreProtoPathRelative(true);

  JavaGenerator java_generator;
  TestGenerator test_generator;
  cli.RegisterGenerator("--java_out", &java_generator, "");
  cli.RegisterGenerator("--test_out", &test_generator, "");

  std::string proto_path = absl::StrCat("-I", ::testing::TempDir());
  std::string java_out = absl::StrCat("--java_out=", ::testing::TempDir());
  std::string test_out = absl::StrCat("--test_out=", ::testing::TempDir());

  const char* argv[] = {"protoc", proto_path.c_str(), java_out.c_str(),
                        test_out.c_str(), "test.proto"};

  EXPECT_EQ(0, cli.Run(5, argv));

  // Loop over the lines of the generated code and verify that we find what we
  // expect

  std::string output;
  ABSL_CHECK_OK(
      File::GetContents(absl::StrCat(::testing::TempDir(), "/Test.java"),
                        &output, true));
  std::vector<std::string> lines = absl::StrSplit(output, '\n');
  bool found_generated_annotation = false;
  bool found_do_not_edit = false;
  for (const auto& line : lines) {
    if (line.find(" DO NOT EDIT!") != std::string::npos) {
      found_do_not_edit = true;
    }
    if (line.find("@com.google.protobuf.Generated") != std::string::npos) {
      found_generated_annotation = true;
    }
  }
  EXPECT_TRUE(found_do_not_edit);
  (void)found_generated_annotation;
}